

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintdevice.cpp
# Opt level: O0

int __thiscall QPaintDevice::metric(QPaintDevice *this,PaintDeviceMetric m)

{
  int iVar1;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  double dVar2;
  qreal qVar3;
  uint in_stack_ffffffffffffff78;
  undefined4 uVar4;
  char *pcVar5;
  char *in_stack_ffffffffffffff88;
  QMessageLogger *in_stack_ffffffffffffff90;
  int local_4c;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0xc) {
    iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,0xb);
    dVar2 = (double)iVar1;
    qVar3 = devicePixelRatioFScale();
    local_4c = (int)(dVar2 * qVar3);
  }
  else if (in_ESI == 5) {
    local_4c = 0;
  }
  else if (in_ESI == 0xb) {
    local_4c = 1;
  }
  else {
    uVar4 = 0;
    pcVar5 = local_28;
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(int)((ulong)pcVar5 >> 0x20),
               (char *)(ulong)in_stack_ffffffffffffff78);
    QMessageLogger::warning(pcVar5,"QPaintDevice::metrics: Device has no metric information");
    switch((char *)(ulong)(in_ESI - 1)) {
    case (char *)0x0:
    case (char *)0x1:
    case (char *)0x2:
    case (char *)0x3:
    case (char *)0x5:
    case (char *)0x8:
    case (char *)0x9:
      local_4c = 0;
      break;
    case (char *)0x4:
    case (char *)0xa:
    case (char *)0xb:
    case (char *)0x6:
    case (char *)0x7:
      local_4c = 0x48;
      break;
    case (char *)0xc:
    case (char *)0xd:
      local_4c = 0;
      break;
    default:
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff90,(char *)(ulong)(in_ESI - 1),(int)((ulong)pcVar5 >> 0x20),
                 (char *)CONCAT44(uVar4,in_stack_ffffffffffffff78));
      QMessageLogger::debug(local_48,"Unrecognized metric %d!",(ulong)in_ESI);
      local_4c = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int QPaintDevice::metric(PaintDeviceMetric m) const
{
    // Fallback: A subclass has not implemented PdmDevicePixelRatioScaled but might
    // have implemented PdmDevicePixelRatio.
    if (m == PdmDevicePixelRatioScaled)
        return this->metric(PdmDevicePixelRatio) * devicePixelRatioFScale();
    if (m == PdmNumColors)
        return 0;
    if (m == PdmDevicePixelRatio)
        return 1;

    qWarning("QPaintDevice::metrics: Device has no metric information");

    switch (m) {
    case PdmDevicePixelRatioScaled:
    case PdmDevicePixelRatio:
    case PdmNumColors:
        Q_UNREACHABLE();
        break;
    case PdmDpiX:
    case PdmDpiY:
        return 72;
    case PdmDevicePixelRatioF_EncodedA:
    case PdmDevicePixelRatioF_EncodedB:
        return 0;
    case PdmWidth:
    case PdmHeight:
    case PdmWidthMM:
    case PdmHeightMM:
    case PdmDepth:
    case PdmPhysicalDpiX:
    case PdmPhysicalDpiY:
        return 0;
    }
    qDebug("Unrecognized metric %d!", m);
    return 0;
}